

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

void bam_plp_destroy(bam_plp_t iter)

{
  olap_hash_t *__ptr;
  lbnode_t *plVar1;
  bam1_t *__ptr_00;
  lbnode_t **pplVar2;
  int iVar3;
  int iVar4;
  mempool_t *pmVar5;
  long lVar6;
  
  __ptr = iter->overlaps;
  if (__ptr != (olap_hash_t *)0x0) {
    free(__ptr->keys);
    free(__ptr->flags);
    free(__ptr->vals);
    free(__ptr);
  }
  pmVar5 = iter->mp;
  plVar1 = iter->dummy;
  pmVar5->cnt = pmVar5->cnt + -1;
  plVar1->next = (__linkbuf_t *)0x0;
  iVar4 = pmVar5->n;
  if (iVar4 == pmVar5->max) {
    iVar3 = 0x100;
    if (iVar4 != 0) {
      iVar3 = iVar4 * 2;
    }
    pmVar5->max = iVar3;
    pplVar2 = (lbnode_t **)realloc(pmVar5->buf,(long)iVar3 << 3);
    pmVar5->buf = pplVar2;
    iVar4 = pmVar5->n;
  }
  else {
    pplVar2 = pmVar5->buf;
  }
  pmVar5->n = iVar4 + 1;
  pplVar2[iVar4] = plVar1;
  pmVar5 = iter->mp;
  plVar1 = iter->head;
  pmVar5->cnt = pmVar5->cnt + -1;
  plVar1->next = (__linkbuf_t *)0x0;
  iVar4 = pmVar5->n;
  if (iVar4 == pmVar5->max) {
    iVar3 = 0x100;
    if (iVar4 != 0) {
      iVar3 = iVar4 * 2;
    }
    pmVar5->max = iVar3;
    pplVar2 = (lbnode_t **)realloc(pmVar5->buf,(long)iVar3 << 3);
    pmVar5->buf = pplVar2;
    iVar4 = pmVar5->n;
  }
  else {
    pplVar2 = pmVar5->buf;
  }
  pmVar5->n = iVar4 + 1;
  pplVar2[iVar4] = plVar1;
  pmVar5 = iter->mp;
  if (pmVar5->cnt != 0) {
    fprintf(_stderr,"[bam_plp_destroy] memory leak: %d. Continue anyway.\n");
    pmVar5 = iter->mp;
  }
  if (0 < pmVar5->n) {
    lVar6 = 0;
    do {
      free((pmVar5->buf[lVar6]->b).data);
      free(pmVar5->buf[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pmVar5->n);
  }
  free(pmVar5->buf);
  free(pmVar5);
  __ptr_00 = iter->b;
  if (__ptr_00 != (bam1_t *)0x0) {
    free(__ptr_00->data);
    free(__ptr_00);
  }
  free(iter->plp);
  free(iter);
  return;
}

Assistant:

void bam_plp_destroy(bam_plp_t iter)
{
    if ( iter->overlaps ) kh_destroy(olap_hash, iter->overlaps);
    mp_free(iter->mp, iter->dummy);
    mp_free(iter->mp, iter->head);
    if (iter->mp->cnt != 0)
        fprintf(stderr, "[bam_plp_destroy] memory leak: %d. Continue anyway.\n", iter->mp->cnt);
    mp_destroy(iter->mp);
    if (iter->b) bam_destroy1(iter->b);
    free(iter->plp);
    free(iter);
}